

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tnt_io.c
# Opt level: O2

void tnt_io_sendv_put(tnt_stream_net *s,iovec *iov,int count)

{
  size_t *psVar1;
  ulong uVar2;
  ulong uVar3;
  
  uVar3 = 0;
  uVar2 = (ulong)(uint)count;
  if (count < 1) {
    uVar2 = uVar3;
  }
  for (; uVar2 * 0x10 != uVar3; uVar3 = uVar3 + 0x10) {
    memcpy((s->sbuf).buf + (s->sbuf).off,*(void **)((long)&iov->iov_base + uVar3),
           *(size_t *)((long)&iov->iov_len + uVar3));
    psVar1 = &(s->sbuf).off;
    *psVar1 = *psVar1 + *(long *)((long)&iov->iov_len + uVar3);
  }
  return;
}

Assistant:

inline static void
tnt_io_sendv_put(struct tnt_stream_net *s, struct iovec *iov, int count) {
	int i;
	for (i = 0 ; i < count ; i++) {
		memcpy(s->sbuf.buf + s->sbuf.off,
		       iov[i].iov_base,
		       iov[i].iov_len);
		s->sbuf.off += iov[i].iov_len;
	}
}